

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_ParseConcatenatedString_Test::
~TextFormatTest_ParseConcatenatedString_Test(TextFormatTest_ParseConcatenatedString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_0191e068;
  pcVar2 = (this->super_TextFormatTest).proto_text_format_._M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).proto_text_format_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTestBase_0191e0a8;
  pcVar2 = (this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
           _M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TextFormatTest).super_TextFormatTestBase.single_line_debug_format_prefix_.
           _M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).super_TextFormatTestBase.single_line_debug_format_prefix_.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_TextFormatTest).super_TextFormatTestBase.proto_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(TextFormatTest, ParseConcatenatedString) {
  // Create a parse string with multiple parts on one line.
  std::string parse_string = "optional_string: \"foo\" \"bar\"\n";

  io::ArrayInputStream input_stream1(parse_string.data(), parse_string.size());
  TextFormat::Parse(&input_stream1, &proto_);

  // Compare.
  EXPECT_EQ("foobar", proto_.optional_string());

  // Create a parse string with multiple parts on separate lines.
  parse_string =
      "optional_string: \"foo\"\n"
      "\"bar\"\n";

  io::ArrayInputStream input_stream2(parse_string.data(), parse_string.size());
  TextFormat::Parse(&input_stream2, &proto_);

  // Compare.
  EXPECT_EQ("foobar", proto_.optional_string());
}